

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

size_type __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
CopyListToTree(InnerMap *this,size_type b,Tree *tree)

{
  MapKey *pMVar1;
  MapKey *pMVar2;
  size_type sVar3;
  MapKey *local_28;
  
  if ((MapKey *)this->table_[b] == (MapKey *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = 0;
    pMVar2 = (MapKey *)this->table_[b];
    do {
      local_28 = pMVar2;
      std::
      _Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
      ::_M_insert_unique<google::protobuf::MapKey*>
                ((_Rb_tree<google::protobuf::MapKey*,google::protobuf::MapKey*,std::_Identity<google::protobuf::MapKey*>,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::InnerMap::KeyCompare,google::protobuf::Map<google::protobuf::MapKey,google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey*>>
                  *)tree,&local_28);
      sVar3 = sVar3 + 1;
      pMVar1 = *(MapKey **)&pMVar2[1].type_;
      *(undefined8 *)&pMVar2[1].type_ = 0;
      pMVar2 = pMVar1;
    } while (pMVar1 != (MapKey *)0x0);
  }
  return sVar3;
}

Assistant:

size_type CopyListToTree(size_type b, Tree* tree) {
      size_type count = 0;
      Node* node = static_cast<Node*>(table_[b]);
      while (node != NULL) {
        tree->insert(KeyPtrFromNodePtr(node));
        ++count;
        Node* next = node->next;
        node->next = NULL;
        node = next;
      }
      return count;
    }